

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

int __thiscall vkt::ubo::UniformBlockCase::init(UniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  UniformLayout *layout;
  pointer *pppSVar1;
  DataType dataType;
  MatrixLoadFlags MVar2;
  UniformBlock *pUVar3;
  pointer pBVar4;
  iterator __position;
  pointer puVar5;
  pointer pUVar6;
  uint uVar7;
  int iVar8;
  DataType DVar9;
  deUint32 dVar10;
  deBool dVar11;
  long *plVar13;
  pointer pBVar14;
  mapped_type *ppvVar15;
  _Rb_tree_header *p_Var16;
  char *pcVar17;
  size_t sVar18;
  pointer pSVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uint uVar21;
  int iVar22;
  pointer pUVar23;
  long *plVar24;
  _Base_ptr p_Var25;
  pointer pSVar26;
  int iVar27;
  _Rb_tree_header *p_Var28;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar29;
  undefined8 extraout_RDX_02;
  ulong uVar30;
  long lVar31;
  long lVar32;
  pointer ppSVar33;
  pointer __rhs;
  long lVar34;
  int iVar35;
  bool bVar36;
  bool bVar37;
  string blockPrefix;
  int curOffset;
  Random rnd;
  MatrixLoadFlags in_stack_fffffffffffffd48;
  vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_> local_298;
  long lStack_280;
  ulong local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  pointer local_248;
  int local_240;
  int local_23c;
  ulong local_238;
  pointer local_230;
  ulong local_228;
  ulong local_220;
  long local_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  _Rb_tree_header *local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  BlockLayoutEntry local_1a8;
  ios_base local_138 [264];
  ulong uVar12;
  
  layout = &this->m_uniformLayout;
  local_248 = (pointer)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                      super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_interface).m_uniformBlocks.
                                     super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)(uint)local_248) {
    local_248 = (pointer)(ulong)((uint)local_248 & 0x7fffffff);
    pUVar23 = (pointer)0x0;
    do {
      pUVar3 = (this->m_interface).m_uniformBlocks.
               super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pUVar23].m_ptr;
      local_230 = pUVar23;
      if ((pUVar3->m_instanceName)._M_string_length == 0) {
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        lVar32 = *(long *)&(pUVar3->m_blockName)._M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,lVar32,(pUVar3->m_blockName)._M_string_length + lVar32);
        std::__cxx11::string::append((char *)&local_268);
      }
      local_23c = 0;
      uVar30 = (ulong)((long)(this->m_uniformLayout).uniforms.
                             super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_uniformLayout).uniforms.
                            super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 6;
      __rhs = *(pointer *)
               &(pUVar3->m_uniforms).
                super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl;
      iVar35 = 0;
      local_238 = local_238 & 0xffffffff00000000;
      local_270 = uVar30;
      if (__rhs != *(pointer *)
                    ((long)&(pUVar3->m_uniforms).
                            super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>
                    + 8)) {
        pBVar14 = (this->m_uniformLayout).blocks.
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar4 = (this->m_uniformLayout).blocks.
                 super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::operator+(&local_1a8.name,&local_268,&__rhs->m_name);
          uVar7 = __rhs->m_flags;
          uVar21 = uVar7;
          if ((uVar7 & 0x20) == 0) {
            uVar21 = pUVar3->m_flags;
          }
          if ((uVar7 & 0xc0) == 0) {
            uVar7 = pUVar3->m_flags;
          }
          ubo::anon_unknown_0::computeStd140Layout
                    (layout,&local_23c,
                     (int)((ulong)((long)pBVar14 - (long)pBVar4) >> 4) * -0x33333333,&local_1a8.name
                     ,&__rhs->m_type,uVar7 & 0xc0 | uVar21 & 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
            operator_delete(local_1a8.name._M_dataplus._M_p,
                            CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                                     local_1a8.name.field_2._M_local_buf[0]) + 1);
          }
          __rhs = __rhs + 1;
        } while (__rhs != *(pointer *)
                           ((long)&(pUVar3->m_uniforms).
                                   super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>
                           + 8));
        local_238 = CONCAT44(local_238._4_4_,local_23c);
        uVar30 = (ulong)((long)(this->m_uniformLayout).uniforms.
                               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_uniformLayout).uniforms.
                              super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6;
      }
      iVar8 = pUVar3->m_arraySize;
      if (pUVar3->m_arraySize < 2) {
        iVar8 = 1;
      }
      local_218 = CONCAT44(local_218._4_4_,iVar8);
      do {
        local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
        local_1a8.name._M_string_length = 0;
        local_1a8.name.field_2._M_local_buf[0] = '\0';
        local_1a8.size = 0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.blockDeclarationNdx = -1;
        local_1a8.bindingNdx = -1;
        local_1a8.instanceNdx = -1;
        std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
        emplace_back<vkt::ubo::BlockLayoutEntry>(&layout->blocks,&local_1a8);
        if (local_1a8.activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.activeUniformIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1a8.activeUniformIndices.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.activeUniformIndices.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
          operator_delete(local_1a8.name._M_dataplus._M_p,
                          CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.name.field_2._M_local_buf[0]) + 1);
        }
        pBVar14 = (this->m_uniformLayout).blocks.
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_assign((string *)(pBVar14 + -1));
        pBVar14[-1].size = (int)local_238;
        pBVar14[-1].bindingNdx = (int)local_230;
        pBVar14[-1].blockDeclarationNdx = (int)local_230;
        pBVar14[-1].instanceNdx = iVar35;
        local_1a8.name._M_dataplus._M_p._0_4_ = (int)local_270;
        if ((int)local_270 < (int)uVar30) {
          uVar12 = local_270;
          do {
            __position._M_current =
                 pBVar14[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar14[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar14[-1].activeUniformIndices,
                         __position,(int *)&local_1a8);
            }
            else {
              *__position._M_current = (int)uVar12;
              pBVar14[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar7 = (uint)local_1a8.name._M_dataplus._M_p + 1;
            uVar12 = (ulong)uVar7;
            local_1a8.name._M_dataplus._M_p._0_4_ = uVar7;
          } while ((int)uVar7 < (int)uVar30);
        }
        if (0 < pUVar3->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,iVar35);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb2a0c0);
          plVar24 = plVar13 + 2;
          if ((long *)*plVar13 == plVar24) {
            local_200 = *plVar24;
            lStack_1f8 = plVar13[3];
            local_210 = &local_200;
          }
          else {
            local_200 = *plVar24;
            local_210 = (long *)*plVar13;
          }
          pppSVar1 = &local_298.
                      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_208 = plVar13[1];
          *plVar13 = (long)plVar24;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_210);
          plVar24 = plVar13 + 2;
          if ((pointer *)*plVar13 == (pointer *)plVar24) {
            local_298.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar24;
            lStack_280 = plVar13[3];
            local_298.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_298.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar24;
            local_298.
            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
          }
          local_298.
          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
          *plVar13 = (long)plVar24;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)(pBVar14 + -1),
                     (ulong)local_298.
                            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if (local_298.
              super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_298.
                            super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_298.
                                  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != (int)local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      pUVar23 = (pointer)((long)&(local_230->name)._M_dataplus._M_p + 1);
    } while (pUVar23 != local_248);
  }
  pBVar14 = (this->m_uniformLayout).blocks.
            super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (this->m_uniformLayout).blocks.
           super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar30 = 0;
  if (pBVar14 != pBVar4) {
    do {
      uVar7 = (int)uVar30 + pBVar14->size;
      uVar30 = (ulong)uVar7;
      pBVar14 = pBVar14 + 1;
    } while (pBVar14 != pBVar4);
    uVar30 = (ulong)(int)uVar7;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,uVar30);
  local_1a8.name._M_dataplus._M_p = local_1a8.name._M_dataplus._M_p & 0xffffffff00000000;
  if (0 < (int)((ulong)((long)(this->m_uniformLayout).blocks.
                              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_uniformLayout).blocks.
                             super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    iVar35 = 0;
    do {
      puVar5 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppvVar15 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[](&this->m_blockPointers,(key_type_conflict *)&local_1a8);
      *ppvVar15 = puVar5 + iVar35;
      pBVar14 = (this->m_uniformLayout).blocks.
                super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar35 = iVar35 + pBVar14[(int)(uint)local_1a8.name._M_dataplus._M_p].size;
      iVar8 = (uint)local_1a8.name._M_dataplus._M_p + 1;
      local_1a8.name._M_dataplus._M_p._0_4_ = iVar8;
      iVar27 = (int)((ulong)((long)(this->m_uniformLayout).blocks.
                                   super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar14) >> 4)
      ;
    } while (SBORROW4(iVar8,iVar27 * -0x33333333) != iVar8 + iVar27 * 0x33333333 < 0);
  }
  deRandom_init((deRandom *)&local_1a8,1);
  local_228 = ((long)(this->m_uniformLayout).blocks.
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_uniformLayout).blocks.
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (0 < (int)(uint)local_228) {
    local_1f0 = &(this->m_blockPointers)._M_t._M_impl.super__Rb_tree_header;
    local_228 = (ulong)((uint)local_228 & 0x7fffffff);
    uVar30 = 0;
    do {
      p_Var25 = (this->m_blockPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = local_1f0;
      p_Var28 = local_1f0;
      if (p_Var25 != (_Base_ptr)0x0) {
        do {
          if ((long)uVar30 <= (long)(int)*(size_t *)(p_Var25 + 1)) {
            p_Var16 = (_Rb_tree_header *)p_Var25;
          }
          p_Var25 = (&p_Var25->_M_left)[(long)(int)*(size_t *)(p_Var25 + 1) < (long)uVar30];
        } while (p_Var25 != (_Base_ptr)0x0);
        if ((p_Var16 != local_1f0) &&
           (p_Var28 = p_Var16, (long)uVar30 < (long)(int)p_Var16->_M_node_count)) {
          p_Var28 = local_1f0;
        }
      }
      pBVar14 = (layout->blocks).
                super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1e0 = uVar30 * 0x50;
      local_220 = (ulong)((long)*(pointer *)
                                 ((long)&pBVar14[uVar30].activeUniformIndices.
                                         super__Vector_base<int,_std::allocator<int>_> + 8) -
                         *(long *)&pBVar14[uVar30].activeUniformIndices.
                                   super__Vector_base<int,_std::allocator<int>_>) >> 2;
      local_1e8 = uVar30;
      if (0 < (int)(uint)local_220) {
        local_1d0 = *(long *)(p_Var28 + 1);
        local_220 = (ulong)((uint)local_220 & 0x7fffffff);
        uVar30 = 0;
        do {
          pUVar6 = (this->m_uniformLayout).uniforms.
                   super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar35 = *(int *)(*(long *)((long)&(((this->m_uniformLayout).blocks.
                                               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_> +
                                     local_1e0) + uVar30 * 4);
          pUVar23 = pUVar6 + iVar35;
          local_1d8 = uVar30;
          DVar9 = glu::getDataTypeScalarType(pUVar6[iVar35].type);
          iVar8 = glu::getDataTypeScalarSize(pUVar6[iVar35].type);
          dataType = pUVar6[iVar35].type;
          bVar36 = dataType - TYPE_FLOAT_MAT2 < 9;
          bVar37 = dataType - TYPE_DOUBLE_MAT2 < 9;
          iVar35 = 1;
          local_270 = CONCAT71(local_270._1_7_,bVar37 || bVar36);
          if (bVar37 || bVar36) {
            if (pUVar23->isRowMajor == true) {
              iVar35 = glu::getDataTypeMatrixNumRows(dataType);
            }
            else {
              iVar35 = glu::getDataTypeMatrixNumColumns(dataType);
            }
          }
          iVar27 = pUVar23->size;
          local_240 = iVar27;
          if (0 < iVar27) {
            local_238 = (long)iVar8 / (long)iVar35 & 0xffffffff;
            lVar32 = local_238 * 4;
            iVar8 = 0;
            local_230 = pUVar23;
            do {
              iVar22 = pUVar23->arrayStride * iVar8;
              if (local_240 < 2) {
                iVar22 = 0;
              }
              if (0 < iVar35) {
                local_248 = (pointer)CONCAT44(local_248._4_4_,iVar8);
                local_218 = local_1d0 + (long)iVar22 + (long)pUVar23->offset;
                iVar8 = 0;
                do {
                  lVar31 = (long)(pUVar23->matrixStride * iVar8);
                  if ((char)local_270 == '\0') {
                    lVar31 = 0;
                  }
                  if (0 < (int)local_238) {
                    lVar31 = lVar31 + local_218;
                    lVar34 = 0;
                    do {
                      if ((int)DVar9 < 0x1f) {
                        if (DVar9 == TYPE_FLOAT) {
                          dVar10 = deRandom_getUint32((deRandom *)&local_1a8);
                          *(float *)(lVar31 + (int)lVar34) = (float)(int)(dVar10 % 0x13 - 9);
                        }
                        else if (DVar9 == TYPE_INT) {
                          dVar10 = deRandom_getUint32((deRandom *)&local_1a8);
                          uVar7 = dVar10 % 0x13 - 9;
                          goto LAB_0066f39f;
                        }
                      }
                      else {
                        if (DVar9 == TYPE_UINT) {
                          dVar10 = deRandom_getUint32((deRandom *)&local_1a8);
                          uVar7 = dVar10 % 10;
                        }
                        else {
                          if (DVar9 != TYPE_BOOL) goto LAB_0066f3a3;
                          dVar11 = deRandom_getBool((deRandom *)&local_1a8);
                          uVar7 = 0;
                          if (dVar11 == 1) {
                            dVar10 = deRandom_getUint32((deRandom *)&local_1a8);
                            uVar7 = dVar10 | 1;
                          }
                        }
LAB_0066f39f:
                        *(uint *)(lVar31 + (int)lVar34) = uVar7;
                      }
LAB_0066f3a3:
                      lVar34 = lVar34 + 4;
                    } while (lVar32 - lVar34 != 0);
                  }
                  iVar8 = iVar8 + 1;
                  pUVar23 = local_230;
                } while (iVar8 != iVar35);
                iVar27 = local_230->size;
                iVar8 = (int)local_248;
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < iVar27);
          }
          uVar30 = local_1d8 + 1;
        } while (uVar30 != local_220);
      }
      uVar30 = local_1e8 + 1;
    } while (uVar30 != local_228);
  }
  MVar2 = this->m_matrixLoadFlag;
  bVar36 = this->m_shuffleUniformMembers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar17 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar17 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffd48 +
                    (int)*(undefined8 *)(local_1a8.name._M_dataplus._M_p + -0x18) + 0x110);
  }
  else {
    sVar18 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar17,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out mediump float v_vtxResult;\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  this_00 = &this->m_interface;
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderInterface::getNamedStructs(this_00,&local_298);
  if (local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar29 = extraout_RDX;
    ppSVar33 = local_298.
               super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      ubo::anon_unknown_0::generateDeclaration((ostringstream *)&local_1a8,*ppSVar33,(int)uVar29);
      ppSVar33 = ppSVar33 + 1;
      uVar29 = extraout_RDX_00;
    } while (ppSVar33 !=
             local_298.
             super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar19 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar26 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pSVar26 - (long)pSVar19) >> 4)) {
    lVar32 = 0;
    lVar31 = 0;
    do {
      pUVar3 = *(UniformBlock **)((long)&pSVar19->m_ptr + lVar32);
      if ((pUVar3->m_flags & 0x200) != 0) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&local_1a8,(int)lVar31,pUVar3,layout,bVar36);
        pSVar19 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar26 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar31 = lVar31 + 1;
      lVar32 = lVar32 + 0x10;
    } while (lVar31 < (int)((ulong)((long)pSVar26 - (long)pSVar19) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  ubo::anon_unknown_0::generateCompareFuncs((ostream *)&local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n",
             0x4c);
  ubo::anon_unknown_0::generateCompareSrc
            ((ostringstream *)&local_1a8,(char *)this_00,(ShaderInterface *)layout,
             (UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB41(MVar2,0),in_stack_fffffffffffffd48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tv_vtxResult = result;\n}\n",0x19);
  std::__cxx11::stringbuf::str();
  if (local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,(string *)&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  MVar2 = this->m_matrixLoadFlag;
  bVar36 = this->m_shuffleUniformMembers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar17 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar17 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffd48 +
                    (int)*(undefined8 *)(local_1a8.name._M_dataplus._M_p + -0x18) + 0x110);
  }
  else {
    sVar18 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar17,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in mediump float v_vtxResult;\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  local_270 = CONCAT44(local_270._4_4_,MVar2);
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderInterface::getNamedStructs(this_00,&local_298);
  if (local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar29 = extraout_RDX_01;
    ppSVar33 = local_298.
               super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      ubo::anon_unknown_0::generateDeclaration((ostringstream *)&local_1a8,*ppSVar33,(int)uVar29);
      ppSVar33 = ppSVar33 + 1;
      uVar29 = extraout_RDX_02;
    } while (ppSVar33 !=
             local_298.
             super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar19 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar26 = (this->m_interface).m_uniformBlocks.
            super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pSVar26 - (long)pSVar19) >> 4)) {
    lVar31 = 0;
    lVar32 = 0;
    do {
      pUVar3 = *(UniformBlock **)((long)&pSVar19->m_ptr + lVar31);
      if ((pUVar3->m_flags & 0x400) != 0) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&local_1a8,(int)lVar32,pUVar3,layout,bVar36);
        pSVar19 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar26 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar32 = lVar32 + 1;
      lVar31 = lVar31 + 0x10;
    } while (lVar32 < (int)((ulong)((long)pSVar26 - (long)pSVar19) >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  ubo::anon_unknown_0::generateCompareFuncs((ostream *)&local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\nvoid main (void)\n{\n\tmediump float result = 1.0;\n",0x31);
  ubo::anon_unknown_0::generateCompareSrc
            ((ostringstream *)&local_1a8,(char *)this_00,(ShaderInterface *)layout,
             (UniformLayout *)&this->m_blockPointers,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,SUB81(local_270,0),in_stack_fffffffffffffd48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x39);
  std::__cxx11::stringbuf::str();
  if (local_298.
      super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,(string *)&local_268);
  paVar20 = &local_268.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar20) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
    paVar20 = extraout_RAX;
  }
  return (int)paVar20;
}

Assistant:

void UniformBlockCase::init (void)
{
	// Compute reference layout.
	computeStd140Layout(m_uniformLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (std::vector<BlockLayoutEntry>::const_iterator blockIter = m_uniformLayout.blocks.begin(); blockIter != m_uniformLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		m_data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)m_uniformLayout.blocks.size(); blockNdx++)
		{
			m_blockPointers[blockNdx] = &m_data[0] + curOffset;
			curOffset += m_uniformLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(m_uniformLayout, m_blockPointers, 1 /* seed */);

	// Generate shaders.
	m_vertShaderSource = generateVertexShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
	m_fragShaderSource = generateFragmentShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
}